

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.c
# Opt level: O1

ON_LINK_DETACH_EVENT_SUBSCRIPTION_HANDLE
link_subscribe_on_link_detach_received
          (LINK_HANDLE link,ON_LINK_DETACH_RECEIVED on_link_detach_received,void *context)

{
  LOGGER_LOG p_Var1;
  
  if (link == (LINK_HANDLE)0x0 || on_link_detach_received == (ON_LINK_DETACH_RECEIVED)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                ,"link_subscribe_on_link_detach_received",0x67d,1,
                "Invalid arguments: link = %p, on_link_detach_received = %p, context = %p",link,
                on_link_detach_received,context);
      return (ON_LINK_DETACH_EVENT_SUBSCRIPTION_HANDLE)0x0;
    }
  }
  else {
    if ((link->on_link_detach_received_event_subscription).on_link_detach_received ==
        (ON_LINK_DETACH_RECEIVED)0x0) {
      (link->on_link_detach_received_event_subscription).on_link_detach_received =
           on_link_detach_received;
      (link->on_link_detach_received_event_subscription).context = context;
      return &link->on_link_detach_received_event_subscription;
    }
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/link.c"
                ,"link_subscribe_on_link_detach_received",0x684,1,
                "Already subscribed for on_link_detach_received events");
      return (ON_LINK_DETACH_EVENT_SUBSCRIPTION_HANDLE)0x0;
    }
  }
  return (ON_LINK_DETACH_EVENT_SUBSCRIPTION_HANDLE)0x0;
}

Assistant:

ON_LINK_DETACH_EVENT_SUBSCRIPTION_HANDLE link_subscribe_on_link_detach_received(LINK_HANDLE link, ON_LINK_DETACH_RECEIVED on_link_detach_received, void* context)
{
    ON_LINK_DETACH_EVENT_SUBSCRIPTION_HANDLE result;

    if ((link == NULL) ||
        (on_link_detach_received == NULL))
    {
        LogError("Invalid arguments: link = %p, on_link_detach_received = %p, context = %p",
            link, on_link_detach_received, context);
        result = NULL;
    }
    else
    {
        if (link->on_link_detach_received_event_subscription.on_link_detach_received != NULL)
        {
            LogError("Already subscribed for on_link_detach_received events");
            result = NULL;
        }
        else
        {
            link->on_link_detach_received_event_subscription.on_link_detach_received = on_link_detach_received;
            link->on_link_detach_received_event_subscription.context = context;

            result = &link->on_link_detach_received_event_subscription;
        }
    }

    return result;
}